

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int solve(SatPos *SatposSolver,SPP *SppSolver,ReadData *decoder,ELLIPSOID type,string *path)

{
  pointer pcVar1;
  BLH blh;
  XYZ Ref;
  XYZ xyz;
  bool bVar2;
  SPP *pSVar3;
  int iVar4;
  long lVar5;
  SPPResult *pSVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  SPPResult result;
  Satellite *local_38e0;
  Obs *local_38d8;
  Ephemeris *local_38d0;
  Ephemeris *local_38c8;
  Obs *local_38c0;
  SPP *local_38b8;
  string *local_38b0;
  double local_38a8;
  undefined8 uStack_38a0;
  undefined1 *local_3890 [2];
  undefined1 local_3880 [16];
  undefined8 local_3870;
  undefined8 uStack_3868;
  double local_3860;
  Ephemeris *local_3858 [2];
  double local_3848;
  SPPResult local_25a0;
  undefined8 local_12e8 [599];
  
  bVar10 = 0;
  local_38b0 = path;
  SPP::GetResult(&local_25a0,SppSolver);
  if ((local_25a0.UserRefPositionXYZ.X == -1.0) && (!NAN(local_25a0.UserRefPositionXYZ.X))) {
    ReadData::GetUserPos(decoder);
    if ((local_3848 != 0.0) || (NAN(local_3848))) {
      ReadData::GetUserPos(decoder);
      blh.L = (double)uStack_3868;
      blh.B = (double)local_3870;
      blh.H = local_3860;
      BLH2XYZ(blh,type,&local_25a0.UserRefPositionXYZ);
      Ref.Y = local_25a0.UserRefPositionXYZ.Y;
      Ref.X = local_25a0.UserRefPositionXYZ.X;
      Ref.Z = local_25a0.UserRefPositionXYZ.Z;
      SPP::setRefPos(SppSolver,Ref);
    }
  }
  dVar12 = local_25a0.GPSR + local_25a0.BDSR;
  uVar9 = 0xffffffff;
  uVar14 = 0;
  local_38b8 = SppSolver;
  do {
    uVar9 = uVar9 + 1;
    if (9 < uVar9) {
      bVar2 = true;
      break;
    }
    local_38a8 = dVar12;
    uStack_38a0 = uVar14;
    local_3858[0] = ReadData::GetGPSEph(decoder);
    local_38e0 = (Satellite *)ReadData::GetGPSObs(decoder);
    pSVar6 = &local_25a0;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateGPSPos(SatposSolver,(SPPResult *)local_3858,&local_38e0);
    if (iVar4 != 0) {
LAB_001059aa:
      bVar2 = false;
      break;
    }
    local_3858[0] = ReadData::GetGPSEph(decoder);
    pSVar6 = &local_25a0;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateSatVel(SatposSolver,(SPPResult *)local_3858,0);
    if (iVar4 != 0) goto LAB_001059aa;
    local_3858[0] = ReadData::GetBDSEph(decoder);
    local_38e0 = (Satellite *)ReadData::GetBDSObs(decoder);
    pSVar6 = &local_25a0;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateBDSPos(SatposSolver,(SPPResult *)local_3858,&local_38e0);
    if (iVar4 != 0) goto LAB_001059aa;
    local_3858[0] = ReadData::GetBDSEph(decoder);
    pSVar6 = &local_25a0;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateSatVel(SatposSolver,(SPPResult *)local_3858,4);
    if (iVar4 != 0) goto LAB_001059aa;
    bVar2 = true;
    local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
    local_38e0 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_38d8 = ReadData::GetGPSObs(decoder);
    local_38c0 = ReadData::GetBDSObs(decoder);
    local_38c8 = ReadData::GetGPSEph(decoder);
    local_38d0 = ReadData::GetBDSEph(decoder);
    pSVar3 = local_38b8;
    iVar4 = SPP::solveSPP(local_38b8,(Satellite **)local_3858,&local_38e0,&local_38d8,&local_38c0,
                          &local_38c8,&local_38d0,type);
    if (iVar4 != 0) {
      bVar2 = false;
      break;
    }
    SPP::GetResult((SPPResult *)local_3858,pSVar3);
    memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
    dVar13 = ABS((local_25a0.GPSR + local_25a0.BDSR) - local_38a8);
    uVar11 = -(ulong)(1e-10 <= dVar13);
    dVar12 = (double)(~uVar11 & (ulong)local_38a8 |
                     (ulong)(local_25a0.GPSR + local_25a0.BDSR) & uVar11);
    uVar14 = uStack_38a0;
  } while (1e-10 <= dVar13);
  local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
  local_38e0 = SatPos::GetPosAndVel(SatposSolver,BDS);
  local_38d8 = ReadData::GetGPSObs(decoder);
  local_38c0 = ReadData::GetBDSObs(decoder);
  local_38c8 = ReadData::GetGPSEph(decoder);
  local_38d0 = ReadData::GetBDSEph(decoder);
  pSVar3 = local_38b8;
  SPP::solveSPV(local_38b8,(Satellite **)local_3858,&local_38e0,&local_38d8,&local_38c0,&local_38c8,
                &local_38d0,type);
  SPP::GetResult((SPPResult *)local_3858,pSVar3);
  memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
  if (bVar2) {
    local_3858[0] = (Ephemeris *)SatPos::GetPosAndVel(SatposSolver,GPS);
    local_38e0 = SatPos::GetPosAndVel(SatposSolver,BDS);
    local_38d8 = ReadData::GetGPSObs(decoder);
    local_38c0 = ReadData::GetBDSObs(decoder);
    local_38c8 = ReadData::GetGPSEph(decoder);
    local_38d0 = ReadData::GetBDSEph(decoder);
    SPP::solveSPV(pSVar3,(Satellite **)local_3858,&local_38e0,&local_38d8,&local_38c0,&local_38c8,
                  &local_38d0,type);
    SPP::GetResult((SPPResult *)local_3858,pSVar3);
    memcpy(&local_25a0,(SPPResult *)local_3858,0x12b8);
    xyz.Y = local_25a0.UserPositionXYZ.Y;
    xyz.X = local_25a0.UserPositionXYZ.X;
    xyz.Z = local_25a0.UserPositionXYZ.Z;
    operator<<((ostream *)&std::cout,xyz);
    memcpy(local_12e8,&local_25a0,0x12b8);
    pcVar1 = (local_38b0->_M_dataplus)._M_p;
    local_3890[0] = local_3880;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3890,pcVar1,pcVar1 + local_38b0->_M_string_length);
    puVar7 = local_12e8;
    puVar8 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    WriteToFile((string *)local_3890);
    if (local_3890[0] != local_3880) {
      operator_delete(local_3890[0]);
    }
    ReadData::ResetObs(decoder);
  }
  return 0;
}

Assistant:

int solve(SatPos &SatposSolver, SPP &SppSolver, ReadData &decoder, ELLIPSOID type, string path) {
    SPPResult result = SppSolver.GetResult();
    if(result.UserRefPositionXYZ.X == -1 && decoder.GetUserPos().H != 0) {
        BLH2XYZ(decoder.GetUserPos(), type, result.UserRefPositionXYZ);
        SppSolver.setRefPos(result.UserRefPositionXYZ);
    }
    // if(SppSolver.re)
    double dt0 = result.GPSR + result.BDSR;
    int count = 0;
    int flag;
    // SATTIME obs;
    while(count < 10)
    {
        flag = SatposSolver.CalculateGPSPos(decoder.GetGPSEph(), decoder.GetGPSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetGPSEph(), GPS, result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateBDSPos(decoder.GetBDSEph(), decoder.GetBDSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetBDSEph(), BDS, result);
        if(flag != 0)
            break;
        flag = SppSolver.solveSPP(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);

        if(flag != 0)
            break;
        result = SppSolver.GetResult();
        double dt1 = result.GPSR + result.BDSR;
        if(abs(dt1 - dt0) < 1e-10)
        {
            break;
        }
        dt0 = dt1;
        count ++;
    } 
    SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                        decoder.GetGPSObs(), decoder.GetBDSObs(), 
                        decoder.GetGPSEph(), decoder.GetBDSEph(), type);
    result = SppSolver.GetResult();
    if(flag == 0) {
        SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);
        result = SppSolver.GetResult();

        cout << result.UserPositionXYZ;
        WriteToFile(result, path);
        decoder.ResetObs();
    }
    return 0;
}